

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O0

void __thiscall Runner::run(Runner *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Optimizer local_88 [4];
  Optimizer local_68;
  Optimizer optimizer;
  pair<std::shared_ptr<Schedule>,_int> local_40;
  uint local_24;
  undefined1 local_20 [4];
  int count;
  ScheduleHandle schedule;
  Runner *this_local;
  
  schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::shared_ptr<Schedule>::shared_ptr((shared_ptr<Schedule> *)local_20);
  Schedule::fromFile(&local_40,&this->input);
  std::tie<std::shared_ptr<Schedule>,int>((shared_ptr<Schedule> *)&optimizer,(int *)local_20);
  std::tuple<std::shared_ptr<Schedule>&,int&>::operator=
            ((tuple<std::shared_ptr<Schedule>&,int&> *)&optimizer,&local_40);
  std::pair<std::shared_ptr<Schedule>,_int>::~pair(&local_40);
  Optimizer::Optimizer(&local_68,this->limit);
  uVar1 = std::__cxx11::string::c_str();
  Optimizer::name_abi_cxx11_(local_88);
  uVar2 = std::__cxx11::string::c_str();
  printf("Running case %s (%d operators) with %s ... \n",uVar1,(ulong)local_24,uVar2);
  std::__cxx11::string::~string((string *)local_88);
  Optimizer::optimize(&local_68,(ScheduleHandle *)local_20,&this->output);
  std::shared_ptr<Schedule>::~shared_ptr((shared_ptr<Schedule> *)local_20);
  return;
}

Assistant:

void run() {
        ScheduleHandle schedule;
        int count;
        std::tie(schedule, count) = Schedule::fromFile(input);
        auto optimizer = Optimizer(limit);
        printf("Running case %s (%d operators) with %s ... \n", input.c_str(), count, optimizer.name().c_str());
        optimizer.optimize(schedule, output);
    }